

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O2

void __thiscall HuffTree::HuffTree(HuffTree *this)

{
  undefined8 __p;
  undefined1 local_40 [12];
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  this->curr_node = (TreeNode *)0x0;
  (this->root)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
  local_40._8_4_ = 0x20;
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  local_28._0_1_ = false;
  local_28._1_3_ = 0;
  uStack_24 = 0;
  uStack_20 = 1;
  std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>((TreeNode *)local_40);
  __p = local_40._0_8_;
  local_40._0_8_ =
       (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
  std::__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::reset
            ((__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
             &this->root,(pointer)__p);
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)local_40);
  TreeNode::~TreeNode((TreeNode *)(local_40 + 8));
  return;
}

Assistant:

HuffTree::HuffTree() {
    root = std::make_unique<TreeNode>(TreeNode());
}